

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_iterator_advance(roaring64_iterator_t *it)

{
  ulong *puVar1;
  ulong uVar2;
  _Bool _Var3;
  uint16_t low16;
  
  puVar1 = (it->art_it).value;
  if (puVar1 == (ulong *)0x0) {
    if (it->saturated_forward != true) {
      roaring64_iterator_init_at(it->r,it,true);
      return it->has_value;
    }
    it->has_value = false;
LAB_001089d8:
    _Var3 = false;
  }
  else {
    uVar2 = *puVar1;
    low16 = (uint16_t)it->value;
    _Var3 = container_iterator_next
                      (it->r->containers[uVar2 >> 8],(uint8_t)uVar2,&it->container_it,&low16);
    if (_Var3) {
      it->value = (ulong)low16 | it->high48;
      it->has_value = true;
    }
    else {
      _Var3 = art_iterator_next(&it->art_it);
      if (!_Var3) {
        it->has_value = false;
        it->saturated_forward = true;
        goto LAB_001089d8;
      }
      roaring64_iterator_init_at_leaf_first(it);
    }
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

bool roaring64_iterator_advance(roaring64_iterator_t *it) {
    if (it->art_it.value == NULL) {
        if (it->saturated_forward) {
            return (it->has_value = false);
        }
        roaring64_iterator_init_at(it->r, it, /*first=*/true);
        return it->has_value;
    }
    leaf_t leaf = (leaf_t)*it->art_it.value;
    uint16_t low16 = (uint16_t)it->value;
    if (container_iterator_next(get_container(it->r, leaf), get_typecode(leaf),
                                &it->container_it, &low16)) {
        it->value = it->high48 | low16;
        return (it->has_value = true);
    }
    if (art_iterator_next(&it->art_it)) {
        return roaring64_iterator_init_at_leaf_first(it);
    }
    it->saturated_forward = true;
    return (it->has_value = false);
}